

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O0

void __thiscall soplex::SPxLPBase<double>::doRemoveCol(SPxLPBase<double> *this,int j)

{
  uint uVar1;
  int iVar2;
  SVectorBase<double> *pSVar3;
  SVectorBase<double> *pSVar4;
  uint *puVar5;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int __c;
  int extraout_EDX_03;
  uint in_ESI;
  SPxLPBase<double> *in_RDI;
  int position_1;
  SVectorBase<double> *movevec;
  SVectorBase<double> *l_vec;
  int idx;
  int position;
  SVectorBase<double> *remvec;
  int i;
  SVectorBase<double> *vec;
  uint in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffbc;
  uint local_1c;
  
  pSVar3 = colVector(in_RDI,in_stack_ffffffffffffffac);
  local_1c = SVectorBase<double>::size(pSVar3);
  iVar2 = extraout_EDX;
  while (local_1c = local_1c - 1, -1 < (int)local_1c) {
    SVectorBase<double>::index(pSVar3,(char *)(ulong)local_1c,iVar2);
    pSVar4 = rowVector_w(in_RDI,in_stack_ffffffffffffffac);
    uVar1 = SVectorBase<double>::pos
                      ((SVectorBase<double> *)
                       CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                       (int)((ulong)in_RDI >> 0x20));
    iVar2 = extraout_EDX_00;
    if (-1 < (int)uVar1) {
      SVectorBase<double>::remove(pSVar4,(char *)(ulong)uVar1);
      iVar2 = extraout_EDX_01;
    }
  }
  iVar2 = nCols((SPxLPBase<double> *)0x229d2c);
  if (in_ESI != iVar2 - 1U) {
    pSVar3 = colVector(in_RDI,in_stack_ffffffffffffffac);
    local_1c = SVectorBase<double>::size(pSVar3);
    iVar2 = extraout_EDX_02;
    while (local_1c = local_1c - 1, -1 < (int)local_1c) {
      SVectorBase<double>::index(pSVar3,(char *)(ulong)local_1c,iVar2);
      pSVar4 = rowVector_w(in_RDI,in_stack_ffffffffffffffac);
      in_stack_ffffffffffffffbc =
           SVectorBase<double>::pos
                     ((SVectorBase<double> *)
                      CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                      (int)((ulong)in_RDI >> 0x20));
      iVar2 = __c;
      if (-1 < (int)in_stack_ffffffffffffffbc) {
        in_stack_ffffffffffffffac = in_ESI;
        puVar5 = (uint *)SVectorBase<double>::index
                                   (pSVar4,(char *)(ulong)in_stack_ffffffffffffffbc,__c);
        *puVar5 = in_stack_ffffffffffffffac;
        iVar2 = extraout_EDX_03;
      }
    }
  }
  LPColSetBase<double>::remove(&in_RDI->super_LPColSetBase<double>,(char *)(ulong)in_ESI);
  return;
}

Assistant:

virtual void doRemoveCol(int j)
   {

      const SVectorBase<R>& vec = colVector(j);
      int i;

      // remove column vector from row file
      for(i = vec.size() - 1; i >= 0; --i)
      {
         SVectorBase<R>& remvec = rowVector_w(vec.index(i));
         int position = remvec.pos(j);

         assert(position != -1);

         if(position >= 0)
            remvec.remove(position);
      }

      // move last column to removed position
      int idx = nCols() - 1;

      if(j != idx)
      {
         const SVectorBase<R>& l_vec = colVector(idx);

         for(i = l_vec.size() - 1; i >= 0; --i)
         {
            SVectorBase<R>& movevec = rowVector_w(l_vec.index(i));
            int position = movevec.pos(idx);

            assert(position != -1);

            if(position >= 0)
               movevec.index(position) = j;
         }
      }

      LPColSetBase<R>::remove(j);
   }